

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

size_t mi_usable_size(void *p)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (long)p - 1U & 0xfffffffffe000000;
  if ((long)uVar1 < 1) {
    return 0;
  }
  lVar2 = ((long)p - uVar1 >> 0x10) * 0x60;
  lVar2 = (uVar1 + lVar2) - (ulong)*(uint *)(uVar1 + 0x124 + lVar2);
  if ((*(byte *)(lVar2 + 0x12e) & 2) == 0) {
    return *(size_t *)(lVar2 + 0x148);
  }
  uVar1 = (long)p - *(long *)(lVar2 + 0x150);
  if (*(byte *)(lVar2 + 0x142) == 0) {
    uVar1 = uVar1 % *(ulong *)(lVar2 + 0x148);
  }
  else {
    uVar1 = uVar1 & ~(-1L << (*(byte *)(lVar2 + 0x142) & 0x3f));
  }
  return *(long *)(lVar2 + 0x148) - uVar1;
}

Assistant:

static inline mi_segment_t* _mi_ptr_segment(const void* p) {
  mi_segment_t* const segment = (mi_segment_t*)(((uintptr_t)p - 1) & ~MI_SEGMENT_MASK);
  #if MI_INTPTR_SIZE <= 4
  return (p==NULL ? NULL : segment);
  #else
  return ((intptr_t)segment <= 0 ? NULL : segment);
  #endif
}